

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O1

DdNode * ddBddToAddRecur(DdManager *dd,DdNode *B)

{
  int *piVar1;
  DdNode *pDVar2;
  DdNode *E;
  DdNode *pDVar3;
  DdNode *pDVar4;
  
  pDVar4 = (DdNode *)((ulong)B & 0xfffffffffffffffe);
  if (pDVar4->index == 0x7fffffff) {
    if (dd->one == B) {
      return dd->one;
    }
    return dd->zero;
  }
  pDVar2 = cuddCacheLookup1(dd,ddBddToAddRecur,B);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  pDVar2 = pDVar4;
  if (((ulong)B & 1) == 0) {
    pDVar2 = B;
  }
  pDVar3 = (pDVar2->type).kids.E;
  pDVar2 = ddBddToAddRecur(dd,(pDVar2->type).kids.T);
  if (pDVar2 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    E = ddBddToAddRecur(dd,pDVar3);
    pDVar3 = pDVar2;
    if (E != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar3 = cuddUniqueInter(dd,pDVar4->index,pDVar2,E);
      if (pDVar3 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar2);
        pDVar3 = E;
      }
      else {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        piVar1 = (int *)(((ulong)E & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        pDVar4 = pDVar3;
        if (((ulong)B & 1) == 0) {
LAB_007eaec9:
          cuddCacheInsert1(dd,ddBddToAddRecur,B,pDVar4);
          return pDVar4;
        }
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = cuddAddCmplRecur(dd,pDVar3);
        if (pDVar4 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,pDVar3);
          piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          goto LAB_007eaec9;
        }
      }
    }
    Cudd_RecursiveDeref(dd,pDVar3);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
ddBddToAddRecur(
  DdManager * dd,
  DdNode * B)
{
    DdNode *one;
    DdNode *res, *res1, *T, *E, *Bt, *Be;
    int complement = 0;

    statLine(dd);
    one = DD_ONE(dd);

    if (Cudd_IsConstant(B)) {
        if (B == one) {
            res = one;
        } else {
            res = DD_ZERO(dd);
        }
        return(res);
    }
    /* Check visited table */
    res = cuddCacheLookup1(dd,ddBddToAddRecur,B);
    if (res != NULL) return(res);

    if (Cudd_IsComplement(B)) {
        complement = 1;
        Bt = cuddT(Cudd_Regular(B));
        Be = cuddE(Cudd_Regular(B));
    } else {
        Bt = cuddT(B);
        Be = cuddE(B);
    }

    T = ddBddToAddRecur(dd, Bt);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = ddBddToAddRecur(dd, Be);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    /* No need to check for T == E, because it is guaranteed not to happen. */
    res = cuddUniqueInter(dd, (int) Cudd_Regular(B)->index, T, E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd ,T);
        Cudd_RecursiveDeref(dd ,E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    if (complement) {
        cuddRef(res);
        res1 = cuddAddCmplRecur(dd, res);
        if (res1 == NULL) {
            Cudd_RecursiveDeref(dd, res);
            return(NULL);
        }
        cuddRef(res1);
        Cudd_RecursiveDeref(dd, res);
        res = res1;
        cuddDeref(res);
    }

    /* Store result. */
    cuddCacheInsert1(dd,ddBddToAddRecur,B,res);

    return(res);

}